

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

JavascriptString * Js::JavascriptString::ToCaseCore<true,true>(JavascriptString *pThis)

{
  char16 cVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  charcount_t cVar6;
  ScriptContext *scriptContext;
  char16 *pcVar7;
  ulong uVar8;
  Recycler *pRVar9;
  undefined4 *puVar10;
  char16 *destString;
  ulong uVar11;
  undefined4 extraout_var;
  JavascriptString *pJVar12;
  undefined4 extraout_var_00;
  char16 cVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 local_68 [8];
  TrackAllocData data;
  ApiError local_34 [2];
  ApiError error;
  
  if (pThis->m_charLength != 0) {
    scriptContext = Js::Type::GetScriptContext((pThis->super_RecyclableObject).type.ptr);
    local_34[0] = NoError;
    uVar14 = pThis->m_charLength;
    uVar15 = (ulong)uVar14;
    pcVar7 = GetString(pThis);
    if (uVar15 != 0) {
      uVar8 = 0;
      do {
        if (0x7f < (ushort)pcVar7[uVar8]) {
          uVar14 = uVar14 + 1;
          if (uVar14 == 0) goto LAB_00d1d607;
          local_68 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_80b8f38;
          data.filename._0_4_ = 0x948;
          data.plusSize = (ulong)uVar14;
          data._32_8_ = scriptContext;
          pRVar9 = Memory::Recycler::TrackAllocInfo
                             (scriptContext->recycler,(TrackAllocData *)local_68);
          BVar4 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          destString = (char16 *)
                       Memory::Recycler::
                       AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                 (pRVar9,(ulong)uVar14 * 2);
          scriptContext = (ScriptContext *)data._32_8_;
          if (destString == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          iVar5 = (*(pThis->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pThis);
          uVar14 = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<true,true>
                             ((char16 *)CONCAT44(extraout_var,iVar5),pThis->m_charLength,destString,
                              uVar14,local_34);
          if (local_34[0] == OutOfMemory) {
            Throw::OutOfMemory();
          }
          if (0x7ffffffd < uVar14 - 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                        ,0x956,
                                        "(requiredStringLength > 0 && IsValidCharCount(requiredStringLength))"
                                        ,
                                        "requiredStringLength > 0 && IsValidCharCount(requiredStringLength)"
                                       );
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          if (local_34[0] != InsufficientBuffer) {
            if (local_34[0] == NoError) {
              if (uVar14 == 1) {
                pJVar12 = CharStringCache::GetStringForChar
                                    ((CharStringCache *)
                                     (*(long *)((long)scriptContext + 8) + 0x1520),*destString);
                return pJVar12;
              }
              goto LAB_00d1d7fc;
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                        ,0x966,"(error == ApiError::InsufficientBuffer)",
                                        "error == ApiError::InsufficientBuffer");
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          if (uVar14 < 2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                        ,0x974,"(requiredStringLength > 1)",
                                        "requiredStringLength > 1");
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          else if (uVar14 == 0xffffffff) goto LAB_00d1d607;
          data.plusSize = (ulong)uVar14 + 1;
          local_68 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_80b8f38;
          data.filename._0_4_ = 0x977;
          pRVar9 = Memory::Recycler::TrackAllocInfo
                             (*(Recycler **)(data._32_8_ + 0x1200),(TrackAllocData *)local_68);
          BVar4 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          destString = (char16 *)
                       Memory::Recycler::
                       AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                 (pRVar9,(ulong)uVar14 * 2 + 2);
          scriptContext = (ScriptContext *)data._32_8_;
          if (destString == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar10 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar3) goto LAB_00d1d821;
            *puVar10 = 0;
          }
          iVar5 = (*(pThis->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pThis);
          cVar6 = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<true,true>
                            ((char16 *)CONCAT44(extraout_var_00,iVar5),pThis->m_charLength,
                             destString,uVar14 + 1,local_34);
          if ((cVar6 == uVar14) && (uVar14 = cVar6, local_34[0] == NoError)) goto LAB_00d1d7fc;
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                      ,0x979,
                                      "(actualStringLength == requiredStringLength && error == ApiError::NoError)"
                                      ,
                                      "actualStringLength == requiredStringLength && error == ApiError::NoError"
                                     );
          if (!bVar3) goto LAB_00d1d821;
          *puVar10 = 0;
          uVar14 = cVar6;
          goto LAB_00d1d7fc;
        }
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
      if (uVar14 == 0xffffffff) {
LAB_00d1d607:
        ::Math::DefaultOverflowPolicy();
      }
    }
    data.plusSize = uVar15 + 1;
    local_68 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_80b8f38;
    data.filename._0_4_ = 0x918;
    pRVar9 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d1d821;
      *puVar10 = 0;
    }
    destString = (char16 *)
                 Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar9,uVar15 * 2 + 2);
    if (destString == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00d1d821:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar10 = 0;
    }
    uVar11 = 0;
    uVar8 = uVar11;
    if (uVar15 != 0) {
      do {
        cVar1 = pcVar7[uVar11];
        cVar13 = cVar1 + L'￠';
        if (0x19 < (ushort)(cVar1 + L'ﾟ')) {
          cVar13 = cVar1;
        }
        destString[uVar11] = cVar13;
        uVar11 = uVar11 + 1;
        uVar8 = uVar15;
      } while (uVar15 != uVar11);
    }
    destString[uVar8] = L'\0';
LAB_00d1d7fc:
    pThis = NewWithBufferT<Js::LiteralString,false>(destString,uVar14,scriptContext);
  }
  return pThis;
}

Assistant:

JavascriptString* JavascriptString::ToCaseCore(JavascriptString* pThis)
    {
        using namespace PlatformAgnostic::UnicodeText;
        if (pThis->GetLength() == 0)
        {
            return pThis;
        }

        ScriptContext* scriptContext = pThis->type->GetScriptContext();
        ApiError error = ApiError::NoError;
        charcount_t pThisLength = pThis->GetLength();

        if (useInvariant)
        {
            const char16 *pThisString = pThis->GetString();
            bool isAscii = true;
            for (charcount_t i = 0; i < pThisLength; i++)
            {
                if (pThisString[i] >= 0x80)
                {
                    isAscii = false;
                    break;
                }
            }

            if (isAscii)
            {
                char16 *ret = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, UInt32Math::Add(pThisLength, 1));
                const char16 diffBetweenCases = 32;
                for (charcount_t i = 0; i < pThisLength; i++)
                {
                    char16 cur = pThisString[i];
                    if (toUpper)
                    {
                        if (cur >= _u('a') && cur <= _u('z'))
                        {
                            ret[i] = cur - diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                    else
                    {
                        if (cur >= _u('A') && cur <= _u('Z'))
                        {
                            ret[i] = cur + diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                }

                ret[pThisLength] = 0;

                return JavascriptString::NewWithBuffer(ret, pThisLength, scriptContext);
            }
        }

        // pre-flight to get the length required, as it may be longer than the original string
        // ICU and Win32(/POSIX) implementations of these functions differ slightly in how to get the required number of characters.
        // For Win32 (LCMapStringEx), you must provide nullptr/0, as providing a buffer that is too small will cause an error and will *not*
        // report the number of characters required. For ICU, however, you can provide a buffer that is too short, and it will still return
        // the length it actually needs.
        //
        // This is a small performance optimization because to(Upper|Lower)Case is can show up hot in certain scenarios.
        // ICU still allows nullptr/0 to be passed to get the string length, and more conservative callers of ChangeStringLinguisticCase should do just that.
        // TODO(jahorto): A truly PlatformAgnostic API wouldn't require cases like this. Once PlatformAgnostic is allowed to use
        // Chakra's memory subsystems, this API should be converted to one that only takes a source string and returns a Recycler-allocated
        // string in the correct case, performed using whatever operation is the fastest available on that platform.
#ifdef INTL_ICU
        charcount_t guessBufferLength = UInt32Math::Add(pThisLength, 1);
        char16 *guessBuffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, guessBufferLength);
#else
        charcount_t guessBufferLength = 0;
        char16 *guessBuffer = nullptr;
#endif

        charcount_t requiredStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), guessBuffer, guessBufferLength, &error);
        if (error == ApiError::OutOfMemory)
        {
            Throw::OutOfMemory();
        }

        // We exit ToCaseCore early if the source string is 0-length, and casing a non-zero length string should
        // never result in a zero-length string.
        AssertOrFailFast(requiredStringLength > 0 && IsValidCharCount(requiredStringLength));

#ifdef INTL_ICU
        if (error == ApiError::NoError)
        {
            if (requiredStringLength == 1)
            {
                // don't create a new string in case we may have cached this string earlier
                return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(guessBuffer[0]);
            }
            else
            {
                // use requiredStringLength instead of guessBufferLength because the string can get shorter
                return JavascriptString::NewWithBuffer(guessBuffer, requiredStringLength, scriptContext);
            }
        }
        AssertOrFailFast(error == ApiError::InsufficientBuffer);
#else
        AssertOrFailFast(error == ApiError::NoError);
        if (requiredStringLength == 1)
        {
            // this one-char string special case is only for non-ICU because there should never be a case where the error
            // was InsufficientBufer but the required length was 1
            char16 buffer[2] = { pThis->GetSz()[0], 0 };
            charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, 2, &error);
            AssertOrFailFast(actualStringLength == 1 && error == ApiError::NoError);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(buffer[0]);
        }
#endif

        AssertOrFailFast(requiredStringLength > 1);

        charcount_t bufferLength = UInt32Math::Add(requiredStringLength, 1);
        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, bufferLength);
        charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, bufferLength, &error);
        AssertOrFailFast(actualStringLength == requiredStringLength && error == ApiError::NoError);
        return JavascriptString::NewWithBuffer(buffer, actualStringLength, scriptContext);
    }